

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,color4f *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *p_Var2;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  color4f *local_18;
  color4f *v_local;
  ostream *os_local;
  
  this = "(";
  local_18 = v;
  v_local = (color4f *)os;
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)this,local_18->r);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  p_Var2 = (_anonymous_namespace_ *)0x2dda9d;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,p_Var2,local_18->g);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  p_Var2 = (_anonymous_namespace_ *)0x2dda9d;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_78,p_Var2,local_18->b);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  p_Var2 = (_anonymous_namespace_ *)0x2dda9d;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_98,p_Var2,local_18->a);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::color4f &v) {
  os << "(" << tinyusdz::dtos(v.r) << ", " << tinyusdz::dtos(v.g) << ", "
     << tinyusdz::dtos(v.b) << ", " << tinyusdz::dtos(v.a) << ")";
  return os;
}